

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O1

string * tinyusdz::print_prop
                   (string *__return_storage_ptr__,Property *prop,string *prop_name,uint32_t indent)

{
  AttrMeta *this;
  vtable_type *pvVar1;
  Path *v;
  bool bVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  ostream *poVar5;
  long lVar6;
  Type indent_00;
  uint32_t extraout_EDX;
  uint32_t extraout_EDX_00;
  uint32_t extraout_EDX_01;
  uint32_t n;
  uint32_t extraout_EDX_02;
  uint32_t extraout_EDX_03;
  uint32_t extraout_EDX_04;
  uint32_t extraout_EDX_05;
  undefined1 in_R8B;
  string ty;
  stringstream ss;
  string local_220;
  string local_200;
  string *local_1e0;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  indent_00 = prop->_type & ~Attrib;
  if (indent_00 == Relation) {
    print_rel_prop(&local_220,prop,prop_name,indent);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_220._M_dataplus._M_p,local_220._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p == &local_220.field_2) goto LAB_0014a897;
  }
  else {
    if (Attrib < prop->_type) {
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"[Invalid Property] ",0x13);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,(prop_name->_M_dataplus)._M_p,prop_name->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
      goto LAB_0014a897;
    }
    this = &(prop->_attrib)._metas;
    bVar2 = AttrMetas::authored(this);
    uVar4 = extraout_EDX;
    if (((bVar2) || ((prop->_attrib)._var._blocked != false)) ||
       (((pvVar1 = (prop->_attrib)._var._value.v_.vtable, pvVar1 == (vtable_type *)0x0 ||
         (uVar3 = (*pvVar1->type_id)(), uVar4 = extraout_EDX_00, uVar3 != 0)) &&
        ((pvVar1 = (prop->_attrib)._var._value.v_.vtable, pvVar1 == (vtable_type *)0x0 ||
         (uVar3 = (*pvVar1->type_id)(), uVar4 = extraout_EDX_01, uVar3 != 1)))))) {
      local_1e0 = __return_storage_ptr__;
      pprint::Indent_abi_cxx11_(&local_220,(pprint *)(ulong)indent,uVar4);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,local_220._M_dataplus._M_p,local_220._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220._M_dataplus._M_p != &local_220.field_2) {
        operator_delete(local_220._M_dataplus._M_p,
                        CONCAT71(local_220.field_2._M_allocated_capacity._1_7_,
                                 local_220.field_2._M_local_buf[0]) + 1);
      }
      if (prop->_has_custom == true) {
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"custom ",7);
      }
      if ((prop->_attrib)._variability == Uniform) {
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"uniform ",8);
      }
      local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
      local_220._M_string_length = 0;
      local_220.field_2._M_local_buf[0] = '\0';
      Attribute::type_name_abi_cxx11_(&local_200,&prop->_attrib);
      std::__cxx11::string::operator=((string *)&local_220,(string *)&local_200);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_200._M_dataplus._M_p != &local_200.field_2) {
        operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
      }
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,local_220._M_dataplus._M_p,local_220._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,(prop_name->_M_dataplus)._M_p,prop_name->_M_string_length);
      if (((prop->_attrib)._var._blocked != false) ||
         (((pvVar1 = (prop->_attrib)._var._value.v_.vtable, pvVar1 == (vtable_type *)0x0 ||
           (uVar4 = (*pvVar1->type_id)(), uVar4 != 0)) &&
          ((pvVar1 = (prop->_attrib)._var._value.v_.vtable, pvVar1 == (vtable_type *)0x0 ||
           (uVar4 = (*pvVar1->type_id)(), uVar4 != 1)))))) {
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8," = ",3);
        if ((prop->_attrib)._var._ts._samples.
            super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            (prop->_attrib)._var._ts._samples.
            super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          pvVar1 = (prop->_attrib)._var._value.v_.vtable;
          if (pvVar1 == (vtable_type *)0x0) {
            bVar2 = false;
          }
          else {
            uVar4 = (*pvVar1->type_id)();
            bVar2 = uVar4 == 4;
          }
          if ((bVar2) || (((prop->_attrib)._var._blocked & 1U) != 0)) {
            std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"None",4);
            goto LAB_0014a43e;
          }
        }
        indent_00 = Attrib;
        value::pprint_value_abi_cxx11_
                  (&local_200,(value *)&(prop->_attrib)._var,(Value *)0x0,1,(bool)in_R8B);
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_1a8,local_200._M_dataplus._M_p,local_200._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_200._M_dataplus._M_p != &local_200.field_2) {
          operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
        }
      }
LAB_0014a43e:
      bVar2 = AttrMetas::authored(this);
      if (bVar2) {
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8," (\n",3);
        print_attr_metas_abi_cxx11_
                  (&local_200,(tinyusdz *)this,(AttrMeta *)(ulong)(indent + 1),indent_00);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (local_1a8,local_200._M_dataplus._M_p,local_200._M_string_length);
        pprint::Indent_abi_cxx11_(&local_1d8,(pprint *)(ulong)indent,n);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,")",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
          operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_200._M_dataplus._M_p != &local_200.field_2) {
          operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
      __return_storage_ptr__ = local_1e0;
      uVar4 = extraout_EDX_02;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220._M_dataplus._M_p != &local_220.field_2) {
        operator_delete(local_220._M_dataplus._M_p,
                        CONCAT71(local_220.field_2._M_allocated_capacity._1_7_,
                                 local_220.field_2._M_local_buf[0]) + 1);
        __return_storage_ptr__ = local_1e0;
        uVar4 = extraout_EDX_03;
      }
    }
    if (((prop->_attrib)._var._ts._samples.
         super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
         ._M_impl.super__Vector_impl_data._M_finish !=
         (prop->_attrib)._var._ts._samples.
         super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
         ._M_impl.super__Vector_impl_data._M_start) && ((prop->_attrib)._variability != Uniform)) {
      pprint::Indent_abi_cxx11_(&local_220,(pprint *)(ulong)indent,uVar4);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,local_220._M_dataplus._M_p,local_220._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220._M_dataplus._M_p != &local_220.field_2) {
        operator_delete(local_220._M_dataplus._M_p,
                        CONCAT71(local_220.field_2._M_allocated_capacity._1_7_,
                                 local_220.field_2._M_local_buf[0]) + 1);
      }
      if (prop->_has_custom == true) {
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"custom ",7);
      }
      local_220._M_string_length = 0;
      local_220.field_2._M_local_buf[0] = '\0';
      local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
      Attribute::type_name_abi_cxx11_(&local_200,&prop->_attrib);
      std::__cxx11::string::operator=((string *)&local_220,(string *)&local_200);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_200._M_dataplus._M_p != &local_200.field_2) {
        operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
      }
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,local_220._M_dataplus._M_p,local_220._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,(prop_name->_M_dataplus)._M_p,prop_name->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,".timeSamples",0xc);
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8," = ",3);
      print_timesamples_abi_cxx11_
                (&local_200,(tinyusdz *)&(prop->_attrib)._var._ts,(TimeSamples *)(ulong)indent,
                 indent_00);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,local_200._M_dataplus._M_p,local_200._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_200._M_dataplus._M_p != &local_200.field_2) {
        operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
      uVar4 = extraout_EDX_04;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220._M_dataplus._M_p != &local_220.field_2) {
        operator_delete(local_220._M_dataplus._M_p,
                        CONCAT71(local_220.field_2._M_allocated_capacity._1_7_,
                                 local_220.field_2._M_local_buf[0]) + 1);
        uVar4 = extraout_EDX_05;
      }
    }
    if ((prop->_attrib)._paths.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        (prop->_attrib)._paths.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
        _M_impl.super__Vector_impl_data._M_start) goto LAB_0014a897;
    pprint::Indent_abi_cxx11_(&local_220,(pprint *)(ulong)indent,uVar4);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_220._M_dataplus._M_p,local_220._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != &local_220.field_2) {
      operator_delete(local_220._M_dataplus._M_p,
                      CONCAT71(local_220.field_2._M_allocated_capacity._1_7_,
                               local_220.field_2._M_local_buf[0]) + 1);
    }
    if (prop->_has_custom == true) {
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"custom ",7);
    }
    if ((prop->_attrib)._variability == Uniform) {
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"uniform ",8);
    }
    local_220._M_string_length = 0;
    local_220.field_2._M_local_buf[0] = '\0';
    local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
    Attribute::type_name_abi_cxx11_(&local_200,&prop->_attrib);
    std::__cxx11::string::operator=((string *)&local_220,(string *)&local_200);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_dataplus._M_p != &local_200.field_2) {
      operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
    }
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,local_220._M_dataplus._M_p,local_220._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,(prop_name->_M_dataplus)._M_p,prop_name->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,".connect = ",0xb);
    v = (prop->_attrib)._paths.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
        _M_impl.super__Vector_impl_data._M_start;
    lVar6 = ((long)(prop->_attrib)._paths.
                   super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)v >> 4) * 0x4ec4ec4ec4ec4ec5;
    if (lVar6 == 0) {
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"[InternalError]",0xf);
    }
    else if (lVar6 == 1) {
      std::operator<<(local_1a8,v);
    }
    else {
      std::operator<<(local_1a8,&(prop->_attrib)._paths);
    }
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p == &local_220.field_2) goto LAB_0014a897;
  }
  operator_delete(local_220._M_dataplus._M_p,
                  CONCAT71(local_220.field_2._M_allocated_capacity._1_7_,
                           local_220.field_2._M_local_buf[0]) + 1);
LAB_0014a897:
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string print_prop(const Property &prop, const std::string &prop_name,
                       uint32_t indent) {
  std::stringstream ss;

  if (prop.is_relationship()) {
    ss << print_rel_prop(prop, prop_name, indent);

    // Attribute or AttributeConnection
  } else if (prop.is_attribute()) {
    const Attribute &attr = prop.get_attribute();

    //
    // May print multiple times.
    // e.g.
    // float var = 1.0
    // float var.timeSamples = ...
    // float var.connect = <...>
    //
    // timeSamples and connect cannot have attrMeta
    // 

    if (attr.metas().authored() || attr.has_value()) {

      ss << pprint::Indent(indent);

      if (prop.has_custom()) {
        ss << "custom ";
      }

      if (attr.variability() == Variability::Uniform) {
        ss << "uniform ";
      } else if (attr.is_varying_authored()) {
        // For Attribute, `varying` is the default variability and does not shown
        // in USDA do nothing
      }

      std::string ty;

      ty = attr.type_name();
      ss << ty << " " << prop_name;

      if (!attr.has_value()) {
        // Nothing to do
      } else {
        // has value content

        ss << " = ";

        if (attr.is_blocked()) {
          ss << "None";
        } else {
          // default value
          ss << value::pprint_value(attr.get_var().value_raw());
        }
      }

      if (prop.get_attribute().metas().authored()) {
        ss << " (\n"
           << print_attr_metas(prop.get_attribute().metas(), indent + 1)
           << pprint::Indent(indent) << ")";
      }

      ss << "\n";
    }

    if (attr.has_timesamples() && (attr.variability() != Variability::Uniform)) {

      ss << pprint::Indent(indent);

      if (prop.has_custom()) {
        ss << "custom ";
      }

      std::string ty;

      ty = attr.type_name();
      ss << ty << " " << prop_name;

      ss << ".timeSamples";

      ss << " = ";

      ss << print_timesamples(attr.get_var().ts_raw(), indent);

      ss << "\n";
    }

    if (attr.has_connections()) {

      ss << pprint::Indent(indent);

      if (prop.has_custom()) {
        ss << "custom ";
      }

      if (attr.variability() == Variability::Uniform) {
        ss << "uniform ";
      } else if (attr.is_varying_authored()) {
        // For Attribute, `varying` is the default variability and does not shown
        // in USDA do nothing
      }

      std::string ty;

      ty = attr.type_name();
      ss << ty << " " << prop_name;

      ss << ".connect = ";

      const std::vector<Path> &paths = attr.connections();
      if (paths.size() == 1) {
        ss << paths[0];
      } else if (paths.size() == 0) {
        ss << "[InternalError]";
      } else {
        ss << paths;
      }

      ss << "\n";
    }

  } else {
    ss << "[Invalid Property] " << prop_name << "\n";
  }

  return ss.str();
}